

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O0

string * Catch::Detail::convertIntoString_abi_cxx11_(StringRef string,bool escapeInvisibles)

{
  StringRef rhs;
  const_iterator pcVar1;
  byte in_CL;
  string *in_RDI;
  char c;
  const_iterator __end2;
  const_iterator __begin2;
  StringRef *__range2;
  string *ret;
  string *in_stack_ffffffffffffff70;
  char *in_stack_ffffffffffffff78;
  string *psVar2;
  const_iterator local_60;
  StringRef local_18;
  
  psVar2 = in_RDI;
  std::__cxx11::string::string((string *)in_RDI);
  StringRef::size(&local_18);
  std::__cxx11::string::reserve((ulong)in_RDI);
  if ((in_CL & 1) == 0) {
    std::__cxx11::string::operator+=((string *)in_RDI,'\"');
    rhs.m_size = (size_type)psVar2;
    rhs.m_start = in_stack_ffffffffffffff78;
    operator+=(in_stack_ffffffffffffff70,rhs);
    std::__cxx11::string::operator+=((string *)in_RDI,'\"');
  }
  else {
    std::__cxx11::string::operator+=((string *)in_RDI,'\"');
    local_60 = StringRef::begin(&local_18);
    pcVar1 = StringRef::end(&local_18);
    for (; local_60 != pcVar1; local_60 = local_60 + 1) {
      switch(*local_60) {
      case '\t':
        std::__cxx11::string::append((char *)in_RDI);
        break;
      case '\n':
        std::__cxx11::string::append((char *)in_RDI);
        break;
      default:
        std::__cxx11::string::push_back((char)in_RDI);
        break;
      case '\f':
        std::__cxx11::string::append((char *)in_RDI);
        break;
      case '\r':
        std::__cxx11::string::append((char *)in_RDI);
      }
    }
    std::__cxx11::string::operator+=((string *)in_RDI,'\"');
  }
  return psVar2;
}

Assistant:

std::string convertIntoString(StringRef string, bool escapeInvisibles) {
        std::string ret;
        // This is enough for the "don't escape invisibles" case, and a good
        // lower bound on the "escape invisibles" case.
        ret.reserve(string.size() + 2);

        if (!escapeInvisibles) {
            ret += '"';
            ret += string;
            ret += '"';
            return ret;
        }

        ret += '"';
        for (char c : string) {
            switch (c) {
            case '\r':
                ret.append("\\r");
                break;
            case '\n':
                ret.append("\\n");
                break;
            case '\t':
                ret.append("\\t");
                break;
            case '\f':
                ret.append("\\f");
                break;
            default:
                ret.push_back(c);
                break;
            }
        }
        ret += '"';

        return ret;
    }